

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

bool __thiscall
dielectric::scatter(dielectric *this,ray *r_in,hit_record *rec,color *attenuation,ray *scattered)

{
  vec3 *v;
  double dVar1;
  double dVar2;
  double local_120;
  ray local_110;
  vec3 local_e0;
  vec3 local_c8;
  undefined1 local_b0 [8];
  vec3 direction;
  bool cannot_refract;
  double sin_theta;
  double local_70;
  double cos_theta;
  vec3 unit_direction;
  double ri;
  double local_40;
  double local_38;
  ray *local_30;
  ray *scattered_local;
  color *attenuation_local;
  hit_record *rec_local;
  ray *r_in_local;
  dielectric *this_local;
  
  local_30 = scattered;
  scattered_local = (ray *)attenuation;
  attenuation_local = &rec->p;
  rec_local = (hit_record *)r_in;
  r_in_local = (ray *)this;
  vec3::vec3((vec3 *)&ri,1.0,1.0,1.0);
  (scattered_local->orig).e[0] = ri;
  (scattered_local->orig).e[1] = local_40;
  (scattered_local->orig).e[2] = local_38;
  if (((ulong)attenuation_local[3].e[0] & 1) == 0) {
    local_120 = this->refraction_index;
  }
  else {
    local_120 = 1.0 / this->refraction_index;
  }
  unit_direction.e[2] = local_120;
  v = ray::direction((ray *)rec_local);
  unit_vector((vec3 *)&cos_theta,v);
  vec3::operator-((vec3 *)&sin_theta,(vec3 *)&cos_theta);
  local_70 = dot((vec3 *)&sin_theta,attenuation_local + 1);
  if (1.0 <= local_70) {
    local_70 = 1.0;
  }
  dVar1 = sqrt(-local_70 * local_70 + 1.0);
  direction.e[2]._7_1_ = 1.0 < unit_direction.e[2] * dVar1;
  vec3::vec3((vec3 *)local_b0);
  if ((direction.e[2]._7_1_ & 1) == 0) {
    dVar1 = reflectance(local_70,unit_direction.e[2]);
    dVar2 = random_double();
    if (dVar1 <= dVar2) {
      refract(&local_e0,(vec3 *)&cos_theta,attenuation_local + 1,unit_direction.e[2]);
      local_b0 = (undefined1  [8])local_e0.e[0];
      direction.e[0] = local_e0.e[1];
      direction.e[1] = local_e0.e[2];
      goto LAB_0010a168;
    }
  }
  reflect(&local_c8,(vec3 *)&cos_theta,attenuation_local + 1);
  local_b0 = (undefined1  [8])local_c8.e[0];
  direction.e[0] = local_c8.e[1];
  direction.e[1] = local_c8.e[2];
LAB_0010a168:
  ray::ray(&local_110,attenuation_local,(vec3 *)local_b0);
  memcpy(local_30,&local_110,0x30);
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, color& attenuation, ray& scattered)
    const override {
        attenuation = color(1.0, 1.0, 1.0);
        double ri = rec.front_face ? (1.0/refraction_index) : refraction_index;

        vec3 unit_direction = unit_vector(r_in.direction());
        double cos_theta = std::fmin(dot(-unit_direction, rec.normal), 1.0);
        double sin_theta = std::sqrt(1.0 - cos_theta*cos_theta);

        bool cannot_refract = ri * sin_theta > 1.0;
        vec3 direction;

        if (cannot_refract || reflectance(cos_theta, ri) > random_double())
            direction = reflect(unit_direction, rec.normal);
        else
            direction = refract(unit_direction, rec.normal, ri);

        scattered = ray(rec.p, direction);
        return true;
    }